

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

void __thiscall
Fossilize::DatabaseInterface::add_imported_metadata
          (DatabaseInterface *this,ExportedMetadataHeader *header)

{
  ExportedMetadataHeader *local_8;
  
  local_8 = header;
  std::
  vector<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
  ::push_back(&this->impl->imported_metadata,&local_8);
  return;
}

Assistant:

void DatabaseInterface::add_imported_metadata(const ExportedMetadataHeader *header)
{
	impl->imported_metadata.push_back(header);
}